

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# node.cpp
# Opt level: O3

int __thiscall despot::QNode::PolicyTreeSize(QNode *this)

{
  int iVar1;
  _Base_ptr p_Var2;
  int iVar3;
  _Rb_tree_header *p_Var4;
  _Self __tmp;
  
  p_Var2 = (this->children_)._M_t._M_impl.super__Rb_tree_header._M_header._M_left;
  p_Var4 = &(this->children_)._M_t._M_impl.super__Rb_tree_header;
  if ((_Rb_tree_header *)p_Var2 == p_Var4) {
    iVar3 = 1;
  }
  else {
    iVar3 = 0;
    do {
      iVar1 = VNode::PolicyTreeSize((VNode *)p_Var2[1]._M_parent);
      iVar3 = iVar3 + iVar1;
      p_Var2 = (_Base_ptr)std::_Rb_tree_increment(p_Var2);
    } while ((_Rb_tree_header *)p_Var2 != p_Var4);
    iVar3 = iVar3 + 1;
  }
  return iVar3;
}

Assistant:

int QNode::PolicyTreeSize() const {
	int size = 0;
	for (map<OBS_TYPE, VNode*>::const_iterator it = children_.begin();
		it != children_.end(); it++) {
		size += it->second->PolicyTreeSize();
	}
	return 1 + size;
}